

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

size_t __thiscall SQASTWriter::writeSingleString(SQASTWriter *this,SQChar *s)

{
  OutputStream *pOVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  size_t idx;
  size_t sVar5;
  
  iVar2 = (*this->stream->_vptr_OutputStream[3])();
  sVar4 = strlen(s);
  OutputStream::writeVaruint(this->stream,sVar4 & 0xffffffff);
  for (sVar5 = 0; pOVar1 = this->stream, sVar4 != sVar5; sVar5 = sVar5 + 1) {
    (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)s[sVar5]);
  }
  iVar3 = (*pOVar1->_vptr_OutputStream[3])();
  return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2);
}

Assistant:

size_t SQASTWriter::writeSingleString(const SQChar *s) {
  size_t startOff = stream->pos();

  size_t stringLength = strlen(s);

  stream->writeUInt32(stringLength);

  for (size_t idx = 0; idx < stringLength; ++idx) {
    stream->writeInt8(s[idx]);
  }

  return stream->pos() - startOff;
}